

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O1

bool __thiscall banksia::WbEngine::stop(WbEngine *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *__buf;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"force","");
  sVar1 = Engine::write((Engine *)this,(int)local_38,__buf,in_RCX);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return (bool)(char)sVar1;
}

Assistant:

bool WbEngine::stop()
{
    return write("force");
}